

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O3

vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> * __thiscall
rudp::session::update_ack
          (vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
           *__return_storage_ptr__,session *this,uint8_t new_acknowledge_head)

{
  byte bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong uVar3;
  pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
  *ppVar4;
  array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
  *paVar5;
  long lVar6;
  byte bVar7;
  value_type *pvVar8;
  long lVar9;
  value_type *__x;
  function<void_(bool)> *pfVar10;
  long lVar11;
  long lVar12;
  
  (__return_storage_ptr__->
  super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = this->acknowledge_head;
  if ((byte)(bVar1 - 1) != new_acknowledge_head) {
    bVar7 = this->send_head;
    if (bVar1 < bVar7) {
      if (new_acknowledge_head < bVar1 || bVar7 <= new_acknowledge_head) {
        return __return_storage_ptr__;
      }
    }
    else {
      if (bVar1 <= bVar7) {
        return __return_storage_ptr__;
      }
      if (new_acknowledge_head < bVar1 && bVar7 <= new_acknowledge_head) {
        return __return_storage_ptr__;
      }
    }
    bVar7 = new_acknowledge_head + 1;
    if (bVar1 < bVar7) {
      lVar9 = (ulong)bVar1 * 0x30;
      lVar11 = 0;
      do {
        lVar11 = (lVar11 + 1) -
                 (ulong)(*(long *)((long)&(this->send_buffer)._M_elems[0].first.
                                          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + lVar9) == 0);
        lVar9 = lVar9 + 0x30;
      } while ((ulong)bVar7 * 0x30 != lVar9);
      if (bVar1 != bVar7) {
        __x = (value_type *)
              ((long)&(this->send_buffer)._M_elems[0].second.super__Function_base._M_functor +
              (ulong)((uint)bVar1 * 0x30));
        do {
          if (__x[-1].super__Function_base._M_manager != (_Manager_type)0x0) {
            std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::
            push_back(__return_storage_ptr__,__x);
          }
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__x[-1]._M_invoker;
          __x[-1].super__Function_base._M_manager = (_Manager_type)0x0;
          __x[-1]._M_invoker = (_Invoker_type)0x0;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          pvVar8 = __x + 1;
          __x = (value_type *)&__x[1].super__Function_base._M_manager;
        } while (pvVar8 != (value_type *)((this->send_buffer)._M_elems + bVar7));
      }
    }
    else if (bVar7 < bVar1) {
      uVar3 = (ulong)bVar1;
      lVar11 = uVar3 * 0x30;
      lVar9 = uVar3 * 0x30 + 0x1070;
      lVar12 = 0;
      if (lVar9 != 0x4070) {
        do {
          lVar12 = (lVar12 + 1) -
                   (ulong)(*(long *)((long)&(this->send_buffer)._M_elems[0].first.
                                            super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + lVar11) == 0);
          lVar11 = lVar11 + 0x30;
        } while (lVar11 != 0x3000);
      }
      if (bVar7 == 0) {
        lVar11 = 0;
      }
      else {
        lVar6 = 0;
        lVar11 = 0;
        do {
          lVar11 = (lVar11 + 1) -
                   (ulong)(*(long *)((long)&(this->send_buffer)._M_elems[0].first.
                                            super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + lVar6) == 0);
          lVar6 = lVar6 + 0x30;
        } while ((ulong)bVar7 * 0x30 != lVar6);
      }
      if ((int)lVar9 != 0x4070) {
        ppVar4 = (this->send_buffer)._M_elems + uVar3;
        lVar9 = uVar3 * -0x30 + 0x3000;
        do {
          pfVar10 = &ppVar4->second;
          if (*(long *)((long)(pfVar10 + -1) + 0x10) != 0) {
            std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::
            push_back(__return_storage_ptr__,pfVar10);
          }
          p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(pfVar10 + -1) + 0x18);
          *(undefined8 *)((long)(pfVar10 + -1) + 0x10) = 0;
          *(undefined8 *)((long)(pfVar10 + -1) + 0x18) = 0;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          ppVar4 = (pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
                    *)(pfVar10 + 1);
          lVar9 = lVar9 + -0x30;
        } while (lVar9 != 0);
      }
      lVar11 = lVar11 + lVar12;
      if (bVar7 != 0) {
        paVar5 = &this->send_buffer;
        do {
          pfVar10 = &paVar5->_M_elems[0].second;
          if (*(long *)((long)(pfVar10 + -1) + 0x10) != 0) {
            std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::
            push_back(__return_storage_ptr__,pfVar10);
          }
          p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(pfVar10 + -1) + 0x18);
          *(undefined8 *)((long)(pfVar10 + -1) + 0x10) = 0;
          *(undefined8 *)((long)(pfVar10 + -1) + 0x18) = 0;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          paVar5 = (array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
                    *)(pfVar10 + 1);
        } while ((pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
                  *)(pfVar10 + 1) != (this->send_buffer)._M_elems + bVar7);
      }
    }
    else {
      lVar11 = 0;
    }
    this->unacknowledged_packet_count = this->unacknowledged_packet_count - lVar11;
    clear_retransmission_timer(this,this->acknowledge_head,bVar7);
    this->acknowledge_head = bVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< send_cb_t > session::update_ack( uint8_t new_acknowledge_head ) {
    std::vector< send_cb_t > cbs;
    if( new_acknowledge_head == uint8_t( acknowledge_head - 1u ) ) return cbs;
    if( !is_valid_sequence_number( new_acknowledge_head ) ) return cbs;
    ++new_acknowledge_head;
    size_t acknowledged_count = 0u;
    if( acknowledge_head < new_acknowledge_head ) {
      acknowledged_count = std::count_if( std::next( send_buffer.begin(), acknowledge_head ), std::next( send_buffer.begin(), new_acknowledge_head ), []( const auto &v ) -> bool { return static_cast< bool >( v.first ); } );
      std::for_each( std::next( send_buffer.begin(), acknowledge_head ), std::next( send_buffer.begin(), new_acknowledge_head ), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
    }
    else if( acknowledge_head > new_acknowledge_head ) {
      acknowledged_count = std::count_if( std::next( send_buffer.begin(), acknowledge_head ), send_buffer.end(), []( const auto &v ) -> bool { return static_cast< bool >( v.first ); } );
      acknowledged_count += std::count_if( send_buffer.begin(), std::next( send_buffer.begin(), new_acknowledge_head ), []( const auto &v ) -> bool { return static_cast< bool >( v.first ); } );
      std::for_each( std::next( send_buffer.begin(), acknowledge_head ), send_buffer.end(), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
      std::for_each( send_buffer.begin(), std::next( send_buffer.begin(), new_acknowledge_head ), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
    }
    unacknowledged_packet_count -= acknowledged_count;
    clear_retransmission_timer( acknowledge_head, new_acknowledge_head );
    acknowledge_head = new_acknowledge_head;
    return cbs;
  }